

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt.h
# Opt level: O0

void __thiscall crnlib::dxt3_block::flip_x(dxt3_block *this,uint w,uint h)

{
  uint value;
  uint value_00;
  undefined4 local_20;
  uint c;
  uint y;
  uint x;
  uint h_local;
  uint w_local;
  dxt3_block *this_local;
  
  for (c = 0; c < w >> 1; c = c + 1) {
    for (local_20 = 0; local_20 < h; local_20 = local_20 + 1) {
      value = get_alpha(this,c,local_20,false);
      value_00 = get_alpha(this,(w - 1) - c,local_20,false);
      set_alpha(this,c,local_20,value_00,false);
      set_alpha(this,(w - 1) - c,local_20,value,false);
    }
  }
  return;
}

Assistant:

inline void flip_x(uint w = 4, uint h = 4)
        {
            for (uint x = 0; x < (w / 2); x++)
            {
                for (uint y = 0; y < h; y++)
                {
                    const uint c = get_alpha(x, y, false);
                    set_alpha(x, y, get_alpha((w - 1) - x, y, false), false);
                    set_alpha((w - 1) - x, y, c, false);
                }
            }
        }